

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

StatisticObject __thiscall Clasp::ClaspFacade::SolveData::BoundArray::at(BoundArray *this,uint32 i)

{
  uint uVar1;
  uint32 uVar2;
  LevelRef *in_RAX;
  StatisticObject SVar3;
  LevelRef *local_38;
  
  local_38 = in_RAX;
  uVar2 = size(this);
  if (i < uVar2) {
    while (uVar1 = (this->refs).ebo_.size, uVar1 <= i) {
      local_38 = (LevelRef *)operator_new(0x10);
      local_38->arr = this;
      local_38->at = uVar1;
      bk_lib::
      pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
      ::push_back(&this->refs,&local_38);
    }
    SVar3 = StatisticObject::
            value<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef,_&Clasp::ClaspFacade::SolveData::BoundArray::LevelRef::value>
                      ((this->refs).ebo_.buf[i]);
    return (StatisticObject)SVar3.handle_;
  }
  Potassco::fail(-2,"StatisticObject Clasp::ClaspFacade::SolveData::BoundArray::at(uint32) const",
                 0x1c1,"i < size()","invalid key",0);
}

Assistant:

StatisticObject at(uint32 i) const {
			POTASSCO_REQUIRE(i < size(), "invalid key");
			while (i >= refs.size()) { refs.push_back(new LevelRef(this, sizeVec(refs))); }
			return StatisticObject::value<LevelRef, &LevelRef::value>(refs[i]);
		}